

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

int __thiscall c4::basic_substring<char>::compare(basic_substring<char> *this,char *that,size_t sz)

{
  ulong uVar1;
  char *pcVar2;
  code *pcVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  size_t sVar7;
  char cVar8;
  char cVar9;
  bool bVar10;
  
  if (sz != 0 && that == (char *)0x0) {
    if ((s_error_flags & 1) != 0) {
      bVar10 = is_debugger_attached();
      if (bVar10) {
        pcVar3 = (code *)swi(3);
        iVar4 = (*pcVar3)();
        return iVar4;
      }
    }
    handle_error(0x250c0a,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14de,"that || sz == 0");
  }
  if ((this->str == (char *)0x0) && (this->len != 0)) {
    if ((s_error_flags & 1) != 0) {
      bVar10 = is_debugger_attached();
      if (bVar10) {
        pcVar3 = (code *)swi(3);
        iVar4 = (*pcVar3)();
        return iVar4;
      }
    }
    handle_error(0x250c0a,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14df,"str || len == 0");
  }
  uVar1 = this->len;
  if ((that == (char *)0x0) || (pcVar2 = this->str, pcVar2 == (char *)0x0)) {
    uVar6 = 0;
    if (uVar1 == sz) {
      if (sz != 0) {
        if ((s_error_flags & 1) != 0) {
          bVar10 = is_debugger_attached();
          if (bVar10) {
            pcVar3 = (code *)swi(3);
            iVar4 = (*pcVar3)();
            return iVar4;
          }
        }
        handle_error(0x250c0a,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14f1,"len == 0 && sz == 0");
      }
    }
    else {
      uVar6 = -(uint)(uVar1 < sz) | 1;
    }
  }
  else {
    sVar7 = sz;
    if (uVar1 < sz) {
      sVar7 = uVar1;
    }
    uVar6 = 0xffffffff;
    bVar10 = sVar7 != 0;
    if (bVar10) {
      cVar8 = *pcVar2;
      cVar9 = *that;
      if (cVar8 == cVar9) {
        uVar5 = 0;
        do {
          if (sVar7 - 1 == uVar5) {
            bVar10 = false;
            goto LAB_002436aa;
          }
          cVar8 = pcVar2[uVar5 + 1];
          cVar9 = that[uVar5 + 1];
          uVar5 = uVar5 + 1;
        } while (cVar8 == cVar9);
        bVar10 = uVar5 < sVar7;
      }
      uVar6 = (uint)(cVar9 <= cVar8) * 2 - 1;
    }
LAB_002436aa:
    if (sz <= uVar1 && !bVar10) {
      uVar6 = (uint)(uVar1 != sz);
    }
  }
  return uVar6;
}

Assistant:

C4_PURE int compare(const char *C4_RESTRICT that, size_t sz) const noexcept
    {
        C4_XASSERT(that || sz  == 0);
        C4_XASSERT(str  || len == 0);
        if(C4_LIKELY(str && that))
        {
            {
                const size_t min = len < sz ? len : sz;
                for(size_t i = 0; i < min; ++i)
                    if(str[i] != that[i])
                        return str[i] < that[i] ? -1 : 1;
            }
            if(len < sz)
                return -1;
            else if(len == sz)
                return 0;
            else
                return 1;
        }
        else if(len == sz)
        {
            C4_XASSERT(len == 0 && sz == 0);
            return 0;
        }
        return len < sz ? -1 : 1;
    }